

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O1

void runnable_function(void *arg,size_t argsz)

{
  void *result;
  size_t local_20;
  size_t result_size;
  
  local_20 = 0;
  result = (void *)(**arg)(*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x10),
                           &local_20);
  future_set(*(future_t **)((long)arg + 0x18),result,local_20);
  free(*(void **)((long)arg + 0x20));
  free(arg);
  return;
}

Assistant:

void runnable_function(void *arg, size_t argsz __attribute__ ((unused))) {
    wrap_t *wrapper = arg;
    size_t result_size = 0;

    void *(*callFunc)(void *, size_t, size_t *) = wrapper->callable.function;
    void *result = callFunc(wrapper->callable.arg, wrapper->callable.argsz, &result_size);

    future_set(wrapper->future, result, result_size);

    free(wrapper->runnable);
    free(wrapper);
}